

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpg_element_vector_provider.h
# Opt level: O3

ElemVec __thiscall
projects::dpg::DpgElementVectorProvider<double>::Eval
          (DpgElementVectorProvider<double> *this,Entity *cell)

{
  non_const_type pMVar1;
  LDLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *pLVar2;
  char cVar3;
  ostream *poVar4;
  Entity *in_RDX;
  Index extraout_RDX;
  ElemVec EVar5;
  ElemMat gramian;
  ElemVec extendedLoadVector;
  ElemMat extendedStiffnessMatrix;
  stringstream ss;
  undefined1 local_248 [32];
  undefined1 local_228 [32];
  undefined1 local_208 [32];
  ElemMat local_1e8;
  undefined1 local_1d0 [40];
  undefined1 local_1a8 [32];
  void *local_188;
  void *local_178;
  
  if (((cell[1]._vptr_Entity == (_func_int **)0x0) || (cell[3]._vptr_Entity == (_func_int **)0x0))
     || (cell[5]._vptr_Entity == (_func_int **)0x0)) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a8 + 0x10),"nullptr error for some provider",0x1f);
    pMVar1 = (non_const_type)(local_248 + 0x10);
    local_248._0_8_ = pMVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_248,
               "extendedLoadVectorProvider_ != nullptr && extendedStiffnessMatrixProvider_ != nullptr && gramianProvider_ != nullptr"
               ,"");
    pLVar2 = (LDLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)(local_228 + 0x10);
    local_228._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../dpg_element_vector_provider.h"
               ,"");
    std::__cxx11::stringbuf::str();
    lf::base::AssertionFailed((string *)local_248,(string *)local_228,0x89,(string *)local_208);
    if ((non_const_type)local_208._0_8_ != (non_const_type)(local_208 + 0x10)) {
      operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
    }
    if ((LDLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_228._0_8_ != pLVar2) {
      operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
    }
    if ((non_const_type)local_248._0_8_ != pMVar1) {
      operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
    }
    local_248._0_8_ = pMVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"false","");
    local_228._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../dpg_element_vector_provider.h"
               ,"");
    local_208._0_8_ = (non_const_type)(local_208 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"");
    lf::base::AssertionFailed((string *)local_248,(string *)local_228,0x89,(string *)local_208);
  }
  else {
    cVar3 = (**(code **)*cell[1]._vptr_Entity)();
    if (cVar3 != '\0') {
      cVar3 = (**(code **)*cell[3]._vptr_Entity)();
      if (cVar3 != '\0') {
        cVar3 = (**(code **)*cell[5]._vptr_Entity)();
        if (cVar3 != '\0') {
          ProductElementVectorProvider<double>::Eval
                    ((ProductElementVectorProvider<double> *)local_1d0,
                     (Entity *)cell[1]._vptr_Entity);
          ProductElementMatrixProvider<double>::Eval
                    ((ElemMat *)(local_1d0 + 0x10),
                     (ProductElementMatrixProvider<double> *)cell[3]._vptr_Entity,in_RDX);
          ProductElementMatrixProvider<double>::Eval
                    (&local_1e8,(ProductElementMatrixProvider<double> *)cell[5]._vptr_Entity,in_RDX)
          ;
          if (local_1e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows == local_1e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols) {
            local_208._0_8_ = (ElemMat *)(local_1d0 + 0x10);
            Eigen::LDLT<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::
            LDLT<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                      ((LDLT<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)local_1a8,
                       (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_1e8);
            Eigen::SolverBase<Eigen::LDLT<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>>::
            _check_solve_assertion<false,Eigen::MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>>>
                      ((SolverBase<Eigen::LDLT<Eigen::Matrix<double,_1,_1,0,_1,_1>,1>> *)local_1a8,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1d0);
            local_228._0_8_ = (LDLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_1a8;
            local_228._8_8_ = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1d0;
            Eigen::
            Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Solve<Eigen::LDLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_0>
            ::Product((Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Solve<Eigen::LDLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
                       *)local_248,(Lhs *)local_208,(Rhs *)local_228);
            Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
            PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Solve<Eigen::LDLT<Eigen::Matrix<double,_1,_1,0,_1,_1>,1>,Eigen::Matrix<double,_1,1,0,_1,1>>,0>>
                      ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
                       (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Solve<Eigen::LDLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                        *)local_248);
            free(local_178);
            free(local_188);
            free((void *)local_1a8._0_8_);
            free(local_1e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data);
            free((void *)local_1d0._16_8_);
            free((void *)local_1d0._0_8_);
            EVar5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
                 extraout_RDX;
            EVar5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
                 (double *)this;
            return (ElemVec)EVar5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage;
          }
          std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1a8 + 0x10),"non quadratic gramian of size (",0x1f);
          poVar4 = std::ostream::_M_insert<long>((long)(local_1a8 + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
          poVar4 = std::ostream::_M_insert<long>((long)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,") on cell ",10);
          poVar4 = lf::mesh::operator<<(poVar4,in_RDX);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          pMVar1 = (non_const_type)(local_248 + 0x10);
          local_248._0_8_ = pMVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_248,"gramian.rows() == gramian.cols()","");
          pLVar2 = (LDLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)(local_228 + 0x10);
          local_228._0_8_ = pLVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_228,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../dpg_element_vector_provider.h"
                     ,"");
          std::__cxx11::stringbuf::str();
          lf::base::AssertionFailed
                    ((string *)local_248,(string *)local_228,0x9a,(string *)local_208);
          if ((non_const_type)local_208._0_8_ != (non_const_type)(local_208 + 0x10)) {
            operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
          }
          if ((LDLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_228._0_8_ != pLVar2) {
            operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
          }
          if ((non_const_type)local_248._0_8_ != pMVar1) {
            operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
          }
          local_248._0_8_ = pMVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"false","");
          local_228._0_8_ = pLVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_228,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../dpg_element_vector_provider.h"
                     ,"");
          local_208._0_8_ = (non_const_type)(local_208 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"");
          lf::base::AssertionFailed
                    ((string *)local_248,(string *)local_228,0x9a,(string *)local_208);
          goto LAB_001962a3;
        }
      }
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a8 + 0x10),"Eval method called on inactive cell",0x23);
    pMVar1 = (non_const_type)(local_248 + 0x10);
    local_248._0_8_ = pMVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_248,
               "extendedLoadVectorProvider_->isActive(cell) && extendedStiffnessMatrixProvider_->isActive(cell) && gramianProvider_->isActive(cell)"
               ,"");
    pLVar2 = (LDLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)(local_228 + 0x10);
    local_228._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../dpg_element_vector_provider.h"
               ,"");
    std::__cxx11::stringbuf::str();
    lf::base::AssertionFailed((string *)local_248,(string *)local_228,0x8d,(string *)local_208);
    if ((non_const_type)local_208._0_8_ != (non_const_type)(local_208 + 0x10)) {
      operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
    }
    if ((LDLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_228._0_8_ != pLVar2) {
      operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
    }
    if ((non_const_type)local_248._0_8_ != pMVar1) {
      operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
    }
    local_248._0_8_ = pMVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"false","");
    local_228._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../dpg_element_vector_provider.h"
               ,"");
    local_208._0_8_ = (non_const_type)(local_208 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"");
    lf::base::AssertionFailed((string *)local_248,(string *)local_228,0x8d,(string *)local_208);
  }
LAB_001962a3:
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::string::~string((string *)local_228);
  std::__cxx11::string::~string((string *)local_248);
  abort();
}

Assistant:

typename DpgElementVectorProvider<SCALAR>::ElemVec
DpgElementVectorProvider<SCALAR>::Eval(const lf::mesh::Entity& cell) {
  // check for nullptrs
  LF_ASSERT_MSG(extendedLoadVectorProvider_ != nullptr &&
                    extendedStiffnessMatrixProvider_ != nullptr &&
                    gramianProvider_ != nullptr,
                "nullptr error for some provider");
  LF_ASSERT_MSG(extendedLoadVectorProvider_->isActive(cell) &&
                    extendedStiffnessMatrixProvider_->isActive(cell) &&
                    gramianProvider_->isActive(cell),
                "Eval method called on inactive cell");

  // evaluate extended element vector l, extended stiffness matrix B and local
  // Gramian G.
  ElemVec extendedLoadVector = extendedLoadVectorProvider_->Eval(cell);
  ElemMat extendedStiffnessMatrix =
      extendedStiffnessMatrixProvider_->Eval(cell);
  ElemMat gramian = gramianProvider_->Eval(cell);

  // perform some size checks.
  LF_ASSERT_MSG(gramian.rows() == gramian.cols(),
                "non quadratic gramian of size ("
                    << gramian.rows() << ", " << gramian.cols() << ") on cell "
                    << cell << "\n");

  // evaluate element vector B^T G^-1 l
  return extendedStiffnessMatrix.transpose() *
         gramian.ldlt().solve(extendedLoadVector);
}